

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall
ON_ClippingRegionPoints::AppendClipPoints
          (ON_ClippingRegionPoints *this,ON_ClippingRegion *clipping_region,size_t world_point_count
          ,size_t world_point_stride,double *world_points)

{
  ON_3dPoint *pOVar1;
  ON_3dPoint clip_point;
  bool bVar2;
  uint clip_flag;
  ON_3dPoint local_48;
  
  bVar2 = true;
  if (world_point_count != 0) {
    if (world_points == (double *)0x0 || world_point_stride < 3) {
      bVar2 = false;
    }
    else {
      pOVar1 = (ON_3dPoint *)(world_points + world_point_count * world_point_stride);
      for (; world_points < pOVar1;
          world_points = &((ON_3dPoint *)world_points)->x + world_point_stride) {
        clip_flag = ON_ClippingRegion::TransformPoint
                              (clipping_region,(ON_3dPoint *)world_points,&local_48);
        clip_point.y = local_48.y;
        clip_point.x = local_48.x;
        clip_point.z = local_48.z;
        AppendClipPoint(this,clip_point,clip_flag);
      }
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool ON_ClippingRegionPoints::AppendClipPoints(
  const class ON_ClippingRegion& clipping_region,
  size_t world_point_count,
  size_t world_point_stride,
  const double* world_points
  )
{
  if ( 0 == world_point_count )
    return true;
  if (world_point_stride < 3 || nullptr == world_points )
    return false;
  const double* P = world_points;
  unsigned int clip_flags;
  ON_3dPoint clip_point;
  for (const double* P1 = world_points + world_point_stride*world_point_count; P < P1; P += world_point_stride)
  {
    clip_flags = clipping_region.TransformPoint(*((const ON_3dPoint*)P),clip_point);
    AppendClipPoint(clip_point,clip_flags);
  }
  return true;
}